

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::kf_copy_cut(Fl_Input *this)

{
  int iVar1;
  EVP_PKEY_CTX *in_RDX;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)&DAT_00000001,in_RDX);
    iVar1 = Fl_Input_::replace(&this->super_Fl_Input_,(this->super_Fl_Input_).position_,
                               (this->super_Fl_Input_).mark_,(char *)0x0,0);
    return iVar1;
  }
  fl_beep(0);
  return 1;
}

Assistant:

int Fl_Input::kf_copy_cut() {
  if (readonly()) { fl_beep(); return 1; }
  copy(1);
  return cut();
}